

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.c
# Opt level: O1

void action_for_each_trigger(char *trigger,_func_void_action_ptr *func)

{
  int iVar1;
  action *paVar2;
  
  paVar2 = (action *)action_list.next;
  if (action_list.next != &action_list) {
    do {
      iVar1 = strcmp(paVar2->name,trigger);
      if (iVar1 == 0) {
        (*func)(paVar2);
      }
      paVar2 = (action *)(paVar2->alist).next;
    } while (paVar2 != (action *)&action_list);
  }
  return;
}

Assistant:

void action_for_each_trigger(const char *trigger,
                             void (*func)(struct action *act))
{
    struct listnode *node;
    struct action *act;
    list_for_each(node, &action_list) {
        act = node_to_item(node, struct action, alist);
        if (!strcmp(act->name, trigger)) {
            func(act);
        }
    }
}